

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

QAbstractItemView * __thiscall QColumnView::createColumn(QColumnView *this,QModelIndex *index)

{
  QAbstractItemView *pQVar1;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  QListView *in_RSI;
  QAbstractScrollArea *in_RDI;
  QListView *view;
  QAbstractItemView *in_stack_00000088;
  QColumnView *in_stack_00000090;
  QWidget *in_stack_ffffffffffffffe8;
  
  pQVar1 = (QAbstractItemView *)operator_new(0x28);
  QAbstractScrollArea::viewport(in_RDI);
  QListView::QListView(in_RSI,in_stack_ffffffffffffffe8);
  initializeColumn(in_stack_00000090,in_stack_00000088);
  (**(code **)(*(long *)&(pQVar1->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x218))
            (pQVar1,in_RSI);
  pQVar2 = QAbstractItemView::model(&in_RSI->super_QAbstractItemView);
  uVar3 = (**(code **)(*(long *)pQVar2 + 0x130))(pQVar2,in_RSI);
  if ((uVar3 & 1) != 0) {
    pQVar2 = QAbstractItemView::model(&in_RSI->super_QAbstractItemView);
    (**(code **)(*(long *)pQVar2 + 0x128))(pQVar2,in_RSI);
  }
  return pQVar1;
}

Assistant:

QAbstractItemView *QColumnView::createColumn(const QModelIndex &index)
{
    QListView *view = new QListView(viewport());

    initializeColumn(view);

    view->setRootIndex(index);
    if (model()->canFetchMore(index))
        model()->fetchMore(index);

    return view;
}